

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeConstraints::applyConstraints(FluctuatingChargeConstraints *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  StuntDouble *pSVar5;
  long in_RDI;
  SimInfo *pSVar6;
  int region_1;
  uint i_1;
  int region;
  int systemCharges;
  RealType regionFrc;
  RealType molFrc;
  RealType systemFrc;
  RealType frc;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  FluctuatingChargeConstraints *in_stack_ffffffffffffff40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff50;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  SimInfo *in_stack_ffffffffffffff60;
  uint local_84;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_ffffffffffffff40);
  }
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    if ((*(byte *)(in_RDI + 10) & 1) != 0) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (double *)in_stack_ffffffffffffff40);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
      std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_ffffffffffffff50._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_ffffffffffffff48._M_current,(int *)in_stack_ffffffffffffff40);
    }
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff60,(MoleculeIterator *)in_stack_ffffffffffffff58);
    while (local_20 != (Molecule *)0x0) {
      bVar1 = Molecule::constrainTotalCharge(local_20);
      if (!bVar1) {
        iVar2 = Molecule::getRegion((Molecule *)0x32dc5c);
        local_28 = Molecule::beginFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffff60,
                              (iterator *)in_stack_ffffffffffffff58);
        while (local_28 != (Atom *)0x0) {
          pSVar6 = (SimInfo *)StuntDouble::getFlucQFrc((StuntDouble *)in_stack_ffffffffffffff40);
          if (((*(byte *)(in_RDI + 10) & 1) != 0) && (-1 < iVar2)) {
            in_stack_ffffffffffffff58 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x28);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar2);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_ffffffffffffff58,(long)*pvVar3);
            *pvVar4 = (double)pSVar6 + *pvVar4;
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar2);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)*pvVar3);
            *pvVar3 = *pvVar3 + 1;
            in_stack_ffffffffffffff60 = pSVar6;
          }
          local_28 = Molecule::nextFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff60,
                                (iterator *)in_stack_ffffffffffffff58);
        }
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff60,(MoleculeIterator *)in_stack_ffffffffffffff58)
      ;
    }
    if ((*(byte *)(in_RDI + 10) & 1) != 0) {
      local_84 = 0;
      while( true ) {
        in_stack_ffffffffffffff50._M_current = (double *)(ulong)local_84;
        pSVar5 = (StuntDouble *)
                 std::vector<double,_std::allocator<double>_>::size
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28));
        if (pSVar5 <= in_stack_ffffffffffffff50._M_current) break;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(ulong)local_84);
        in_stack_ffffffffffffff48._M_current = (double *)(double)*pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                            (ulong)local_84);
        *pvVar4 = *pvVar4 / (double)in_stack_ffffffffffffff48._M_current;
        local_84 = local_84 + 1;
      }
    }
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff60,(MoleculeIterator *)in_stack_ffffffffffffff58);
    while (local_20 != (Molecule *)0x0) {
      bVar1 = Molecule::constrainTotalCharge(local_20);
      if (bVar1) {
        local_28 = Molecule::beginFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffff60,
                              (iterator *)in_stack_ffffffffffffff58);
        while (local_28 != (Atom *)0x0) {
          StuntDouble::getFlucQFrc((StuntDouble *)in_stack_ffffffffffffff40);
          local_28 = Molecule::nextFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff60,
                                (iterator *)in_stack_ffffffffffffff58);
        }
        Molecule::getNFluctuatingCharges((Molecule *)0x32df0d);
        local_28 = Molecule::beginFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffff60,
                              (iterator *)in_stack_ffffffffffffff58);
        while (local_28 != (Atom *)0x0) {
          StuntDouble::getFlucQFrc((StuntDouble *)in_stack_ffffffffffffff40);
          StuntDouble::setFlucQFrc
                    ((StuntDouble *)in_stack_ffffffffffffff50._M_current,
                     (RealType)in_stack_ffffffffffffff48._M_current);
          local_28 = Molecule::nextFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff60,
                                (iterator *)in_stack_ffffffffffffff58);
        }
      }
      else {
        iVar2 = Molecule::getRegion((Molecule *)0x32dfd8);
        if (((*(byte *)(in_RDI + 10) & 1) == 0) || (iVar2 < 0)) {
          local_28 = Molecule::beginFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff60,
                                (iterator *)in_stack_ffffffffffffff58);
          while (local_28 != (Atom *)0x0) {
            StuntDouble::getFlucQFrc((StuntDouble *)in_stack_ffffffffffffff40);
            StuntDouble::setFlucQFrc
                      ((StuntDouble *)in_stack_ffffffffffffff50._M_current,
                       (RealType)in_stack_ffffffffffffff48._M_current);
            local_28 = Molecule::nextFluctuatingCharge
                                 ((Molecule *)in_stack_ffffffffffffff60,
                                  (iterator *)in_stack_ffffffffffffff58);
          }
        }
        else {
          in_stack_ffffffffffffff40 = (FluctuatingChargeConstraints *)(in_RDI + 0x28);
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar2);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                     (long)*pvVar3);
          local_28 = Molecule::beginFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff60,
                                (iterator *)in_stack_ffffffffffffff58);
          while (local_28 != (Atom *)0x0) {
            StuntDouble::getFlucQFrc((StuntDouble *)in_stack_ffffffffffffff40);
            StuntDouble::setFlucQFrc
                      ((StuntDouble *)in_stack_ffffffffffffff50._M_current,
                       (RealType)in_stack_ffffffffffffff48._M_current);
            local_28 = Molecule::nextFluctuatingCharge
                                 ((Molecule *)in_stack_ffffffffffffff60,
                                  (iterator *)in_stack_ffffffffffffff58);
          }
        }
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff60,(MoleculeIterator *)in_stack_ffffffffffffff58)
      ;
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::applyConstraints() {
    if (!initialized_) initialize();
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    RealType frc, systemFrc, molFrc, regionFrc;
    int systemCharges;

    // accumulate the system fluctuating charge forces, but we have
    // separate constraints for any charges in defined regions and for
    // molecules with constrained charges:

    systemFrc     = 0.0;
    systemCharges = 0;
    if (constrainRegions_) {
      std::fill(regionForce_.begin(), regionForce_.end(), 0.0);
      std::fill(regionCharges_.begin(), regionCharges_.end(), 0);
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (!mol->constrainTotalCharge()) {
        int region = mol->getRegion();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          frc = atom->getFlucQFrc();
          if (constrainRegions_ && region >= 0) {
            regionForce_[regionKeys_[region]] += frc;
            regionCharges_[regionKeys_[region]] += 1;
          } else {
            systemFrc += frc;
            systemCharges += 1;
          }
        }
      }
    }

#ifdef IS_MPI
    // in parallel, we need to add up the contributions from all
    // processors:
    MPI_Allreduce(MPI_IN_PLACE, &systemFrc, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &systemCharges, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    if (constrainRegions_) {
      MPI_Allreduce(MPI_IN_PLACE, &regionForce_[0], regionForce_.size(),
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &regionCharges_[0], regionCharges_.size(),
                    MPI_INT, MPI_SUM, MPI_COMM_WORLD);
    }

#endif

    // divide by the total number of fluctuating charges:
    systemFrc /= systemCharges;

    // do the same in the regions:
    if (constrainRegions_) {
      for (unsigned int i = 0; i < regionForce_.size(); ++i) {
        regionForce_[i] /= regionCharges_[i];
      }
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      molFrc = 0.0;

      if (mol->constrainTotalCharge()) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          molFrc += atom->getFlucQFrc();
        }
        molFrc /= mol->getNFluctuatingCharges();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          frc = atom->getFlucQFrc() - molFrc;
          atom->setFlucQFrc(frc);
        }
      } else {
        int region = mol->getRegion();

        regionFrc = 0.0;
        if (constrainRegions_ && region >= 0) {
          regionFrc = regionForce_[regionKeys_[region]];

          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            frc = atom->getFlucQFrc() - regionFrc;
            atom->setFlucQFrc(frc);
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            frc = atom->getFlucQFrc() - systemFrc;
            atom->setFlucQFrc(frc);
          }
        }
      }
    }
  }